

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

x86Reg __thiscall
CodeGenGenericContext::FindRegAtMemory
          (CodeGenGenericContext *this,x86Size size,x86Reg index,int multiplier,x86Reg base,
          uint shift,bool checkRegisters)

{
  uint uVar1;
  x86Reg xVar2;
  int iVar3;
  x86Reg xVar4;
  x86Reg xVar5;
  ulong uVar6;
  int *piVar7;
  bool bVar8;
  x86Argument newArg;
  uint local_60;
  x86Reg local_5c;
  int local_58;
  x86Reg local_54;
  x86Argument local_50;
  
  local_60 = shift;
  local_5c = base;
  local_58 = multiplier;
  local_54 = index;
  RedirectAddressComputation(this,&local_54,&local_58,&local_5c,&local_60);
  xVar4 = local_54;
  iVar3 = local_58;
  xVar2 = local_5c;
  uVar1 = local_60;
  local_50.type = argPtr;
  local_50.ptrBase = local_5c;
  local_50.ptrIndex = local_54;
  local_50.ptrMult = local_58;
  local_50.ptrNum = local_60;
  local_50.field_1.ptrSize = size;
  xVar5 = MemFind(this,&local_50);
  bVar8 = true;
  if (xVar5 != rNONE) {
    xVar5 = xVar5 - rEAX;
    if (this->memCache[xVar5].value.type == argReg) {
      xVar5 = this->memCache[xVar5].value.field_1.reg;
      bVar8 = false;
    }
  }
  if (bVar8) {
    if (checkRegisters) {
      piVar7 = &this->genReg[0].ptrNum;
      uVar6 = 0;
      bVar8 = false;
      do {
        if ((((((x86Argument *)(piVar7 + -7))->type == argPtr) &&
             (((anon_union_8_6_73be8994_for_x86Argument_2 *)(piVar7 + -5))->reg == size)) &&
            (piVar7[-3] == xVar2)) &&
           (((piVar7[-2] == xVar4 && (piVar7[-1] == iVar3)) && (*piVar7 == uVar1)))) {
          xVar5 = (x86Reg)uVar6;
          break;
        }
        bVar8 = 0xf < uVar6;
        uVar6 = uVar6 + 1;
        piVar7 = piVar7 + 8;
      } while (uVar6 != 0x11);
      if (!bVar8) {
        return xVar5;
      }
    }
    xVar5 = rRegCount;
  }
  return xVar5;
}

Assistant:

x86Reg CodeGenGenericContext::FindRegAtMemory(x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, bool checkRegisters)
{
#ifdef NULLC_OPTIMIZE_X86
	RedirectAddressComputation(index, multiplier, base, shift);

	x86Argument newArg = x86Argument(size, index, multiplier, base, shift);

	if(unsigned memIndex = MemFind(newArg))
	{
		memIndex--;

		if(memCache[memIndex].value.type == x86Argument::argReg)
			return memCache[memIndex].value.reg;
	}

	if(checkRegisters)
	{
		// If another register contains data from memory
		for(unsigned i = 0; i < rRegCount; i++)
		{
			if(genReg[i].type == x86Argument::argPtr && genReg[i] == newArg)
				return (x86Reg)i;
		}
	}
#endif

	return rRegCount;
}